

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O2

int queue_segment_start(mixed_segment *segment)

{
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  
  pvVar2 = segment->data;
  bVar4 = 0;
  while (uVar5 = (ulong)bVar4, (uint)bVar4 < *(uint *)((long)pvVar2 + 0x18)) {
    bVar4 = bVar4 + 1;
    if (*(long *)(*(long *)((long)pvVar2 + 0x10) + uVar5 * 8) == 0) {
      mixed_err(0x16);
      return 0;
    }
  }
  uVar1 = *(uint *)((long)pvVar2 + 0x28);
  uVar3 = 0;
  do {
    uVar6 = uVar3 & 0xff;
    if (uVar1 <= uVar6) goto LAB_0013dfeb;
    uVar3 = uVar6 + 1;
  } while (*(long *)(*(long *)((long)pvVar2 + 0x20) + (ulong)uVar6 * 8) != 0);
  mixed_err(0x16);
LAB_0013dfeb:
  return (uint)(uVar1 <= uVar6);
}

Assistant:

int queue_segment_start(struct mixed_segment *segment){
  struct queue_segment_data *data = (struct queue_segment_data *)segment->data;
  for(mixed_channel_t i=0; i<data->out_count; ++i){
    if(data->out[i] == 0){
      mixed_err(MIXED_BUFFER_MISSING);
      return 0;
    }
  }
  for(mixed_channel_t i=0; i<data->in_count; ++i){
    if(data->in[i] == 0){
      mixed_err(MIXED_BUFFER_MISSING);
      return 0;
    }
  }
  return 1;
}